

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  long *plVar3;
  char *__s_00;
  long lVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Starting Plugin Manager...",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  lVar4 = 0;
  do {
    __s = *(char **)((long)&PTR_anon_var_dwarf_8fd_00103d50 + lVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"========= ",10);
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x105058);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," =========",10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    plVar3 = (long *)IPluginManager::Get();
    plVar3 = (long *)(**(code **)(*plVar3 + 0x10))(plVar3,__s);
    if (plVar3 != (long *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Plugin name: ",0xd);
      __s_00 = (char *)(**(code **)(*plVar3 + 0x10))(plVar3);
      if (__s_00 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x105058);
      }
      else {
        sVar2 = strlen(__s_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s_00,sVar2);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      plVar3 = (long *)__dynamic_cast(plVar3,&IPlugin::typeinfo,&ICustomPlugin::typeinfo,0);
      if (plVar3 == (long *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Plugin does not implement ICustomPlugin.",0x28);
        plVar3 = &std::cout;
      }
      else {
        (**(code **)(*plVar3 + 0x18))(plVar3,"Agustin");
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Plugin->doSomething(4, 5) = ",0x1c);
        iVar1 = (**(code **)(*plVar3 + 0x20))(plVar3,4,5);
        plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
      }
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      plVar3 = (long *)IPluginManager::Get();
      (**(code **)(*plVar3 + 0x18))(plVar3,__s);
    }
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x18);
  std::istream::get();
  return 0;
}

Assistant:

int main()
{
	const char* plugins[] = { "pluginA", "pluginB", "pluginC" };

	std::cout << "Starting Plugin Manager..." << std::endl;
	for ( const auto pluginFilename : plugins )
	{
		std::cout << "========= " << pluginFilename << " =========" << std::endl;
		if ( IPlugin* plugin = IPluginManager::Get()->loadPlugin( pluginFilename ) )
		{
			std::cout << "Plugin name: " << plugin->name() << std::endl;
			if ( ICustomPlugin* customPlugin = dynamic_cast<ICustomPlugin*>( plugin ) )
			{
				customPlugin->sayHelloTo( "Agustin" );
				std::cout << "Plugin->doSomething(4, 5) = " << customPlugin->doSomething( 4, 5 ) << std::endl;
			}
			else
			{
				std::cout << "Plugin does not implement ICustomPlugin." << std::endl;
			}
			IPluginManager::Get()->unloadPlugin( pluginFilename );
		}
	}

	std::cin.get();
	return 0;
}